

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_flow_stmt(gvisitor_t *self,gnode_flow_stmt_t *node)

{
  gtoken_t gVar1;
  long *plVar2;
  ulong uVar3;
  int *piVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int *piVar10;
  gnode_t *pgVar11;
  gnode_label_stmt_t *case_stmt;
  ulong uVar12;
  ircode_t *piVar13;
  
  gVar1 = (node->base).token.type;
  if (gVar1 == TOK_KEY_IF) {
    plVar2 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
    if ((plVar2 != (long *)0x0) && ((gravity_class_t *)*plVar2 == gravity_class_function)) {
      piVar13 = (ircode_t *)plVar2[0x14];
      uVar6 = ircode_newlabel(piVar13);
      uVar5 = ircode_newlabel(piVar13);
      gvisit(self,node->cond);
      uVar7 = ircode_register_pop(piVar13);
      if (uVar7 == 0xffffffff) {
        report_error(self,&node->base,"Invalid if condition expression.");
      }
      ircode_add(piVar13,JUMPF,uVar7,uVar5,0,(node->base).token.lineno);
      gvisit(self,node->stmt);
      if (node->elsestmt != (gnode_t *)0x0) {
        ircode_add(piVar13,JUMP,uVar6,0,0,(node->base).token.lineno);
      }
      ircode_marklabel(piVar13,uVar5,(node->base).token.lineno);
      if (node->elsestmt == (gnode_t *)0x0) {
        return;
      }
      gvisit(self,node->elsestmt);
LAB_00138b79:
      ircode_marklabel(piVar13,uVar6,(node->base).token.lineno);
      return;
    }
LAB_00138aa7:
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  if (gVar1 != TOK_KEY_SWITCH) {
    if (gVar1 != TOK_OP_TERNARY) {
      __assert_fail("(type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH) || (type == TOK_OP_TERNARY)",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                    ,0x221,"void visit_flow_stmt(gvisitor_t *, gnode_flow_stmt_t *)");
    }
    plVar2 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
    if ((plVar2 != (long *)0x0) && ((gravity_class_t *)*plVar2 == gravity_class_function)) {
      piVar13 = (ircode_t *)plVar2[0x14];
      uVar5 = ircode_newlabel(piVar13);
      uVar6 = ircode_newlabel(piVar13);
      gvisit(self,node->cond);
      uVar7 = ircode_register_pop(piVar13);
      if (uVar7 == 0xffffffff) {
        report_error(self,&node->base,"Invalid ternary condition expression.");
      }
      ircode_add(piVar13,JUMPF,uVar7,uVar5,0,(node->base).token.lineno);
      gvisit(self,node->stmt);
      uVar7 = ircode_register_pop(piVar13);
      if (uVar7 == 0xffffffff) {
        report_error(self,&node->base,"Invalid ternary left stmt expression.");
      }
      ircode_add(piVar13,JUMP,uVar6,0,0,(node->base).token.lineno);
      ircode_marklabel(piVar13,uVar5,(node->base).token.lineno);
      gvisit(self,node->elsestmt);
      uVar5 = ircode_register_last(piVar13);
      if (uVar5 == 0xffffffff) {
        report_error(self,&node->base,"Invalid ternary right stmt expression.");
      }
      goto LAB_00138b79;
    }
    goto LAB_00138aa7;
  }
  plVar2 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar2 == (long *)0x0) || ((gravity_class_t *)*plVar2 != gravity_class_function))
  goto LAB_00138aa7;
  piVar13 = (ircode_t *)plVar2[0x14];
  uVar6 = ircode_newlabel(piVar13);
  ircode_setlabel_false(piVar13,uVar6);
  gvisit(self,node->cond);
  uVar5 = ircode_register_last(piVar13);
  if (uVar5 == 0xffffffff) {
    report_error(self,&node->base,"Invalid switch condition expression.");
  }
  pgVar11 = node->stmt;
  if ((pgVar11 == (gnode_t *)0x0) || (pgVar11->tag != NODE_COMPOUND_STAT)) {
    report_error(self,&node->base,"Invalid switch stmt expression.");
    pgVar11 = node->stmt;
  }
  uVar7 = uVar6;
  if ((*(ulong **)&pgVar11[1].block_length != (ulong *)0x0) &&
     (uVar3 = **(ulong **)&pgVar11[1].block_length, uVar3 != 0)) {
    piVar10 = (int *)0x0;
    uVar12 = 0;
    do {
      if (((uVar12 < **(ulong **)&pgVar11[1].block_length) &&
          (piVar4 = *(int **)((*(ulong **)&pgVar11[1].block_length)[2] + uVar12 * 8),
          piVar4 != (int *)0x0)) && (*piVar4 == 2)) {
        if (piVar4[4] == 10) {
          uVar8 = ircode_newlabel(piVar13);
          piVar4[0x16] = uVar8;
          piVar10 = piVar4;
        }
        else if (piVar4[4] == 0x25) {
          gvisit(self,*(gnode_t **)(piVar4 + 0x12));
          uVar8 = ircode_register_pop(piVar13);
          if (uVar8 == 0xffffffff) {
            report_error(self,&node->base,"Invalid switch case expression.");
          }
          uVar9 = ircode_newlabel(piVar13);
          piVar4[0x16] = uVar9;
          ircode_add(piVar13,NEQ,uVar8,uVar5,uVar8,piVar4[5]);
          ircode_add(piVar13,JUMPF,uVar8,piVar4[0x16],0,piVar4[5]);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
    if (piVar10 != (int *)0x0) {
      uVar7 = piVar10[0x16];
      if (node == (gnode_flow_stmt_t *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = piVar10[5];
      }
      goto LAB_00138bd0;
    }
    if (node == (gnode_flow_stmt_t *)0x0) {
      uVar5 = 0;
      goto LAB_00138bd0;
    }
  }
  uVar5 = (node->base).token.lineno;
LAB_00138bd0:
  ircode_add(piVar13,JUMP,uVar7,0,0,uVar5);
  ircode_register_pop(piVar13);
  gvisit(self,node->stmt);
  ircode_marklabel(piVar13,uVar6,(node->base).token.lineno);
  ircode_unsetlabel_false(piVar13);
  return;
}

Assistant:

static void visit_flow_stmt (gvisitor_t *self, gnode_flow_stmt_t *node) {
    DEBUG_CODEGEN("visit_flow_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH) || (type == TOK_OP_TERNARY));

    if (type == TOK_KEY_IF) {
        visit_flow_if_stmt(self, node);
    } else if (type == TOK_KEY_SWITCH) {
        visit_flow_switch_stmt(self, node);
    } else if (type == TOK_OP_TERNARY) {
        visit_flow_ternary_stmt(self, node);
    }
}